

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

FuncDef * sqlite3FindFunction(sqlite3 *db,char *zName,int nArg,u8 enc,u8 createFlag)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  HashElem *pHVar5;
  FuncDef *pFVar6;
  FuncDef *data;
  int iVar7;
  uint h;
  uint local_34;
  
  if (zName == (char *)0x0) {
    uVar1 = 0;
  }
  else {
    sVar4 = strlen(zName);
    uVar1 = (uint)sVar4 & 0x3fffffff;
  }
  pHVar5 = findElementWithHash(&db->aFunc,zName,&local_34);
  iVar7 = 0;
  if (pHVar5 == (HashElem *)0x0) {
    pFVar6 = (FuncDef *)0x0;
  }
  else {
    pFVar6 = (FuncDef *)pHVar5->data;
  }
  data = (FuncDef *)0x0;
  if (pFVar6 != (FuncDef *)0x0) {
    iVar7 = 0;
    do {
      iVar2 = matchQuality(pFVar6,nArg,enc);
      if (iVar7 < iVar2) {
        data = pFVar6;
        iVar7 = iVar2;
      }
      pFVar6 = pFVar6->pNext;
    } while (pFVar6 != (FuncDef *)0x0);
  }
  if ((createFlag == '\0') && ((data == (FuncDef *)0x0 || ((db->flags & 0x200000) != 0)))) {
    uVar3 = ""[(byte)*zName] + uVar1;
    pFVar6 = functionSearch(uVar3 / 0x17 + (uVar3 / 0x17) * -0x18 + uVar3,zName);
    if (pFVar6 == (FuncDef *)0x0) {
      iVar7 = 0;
    }
    else {
      iVar7 = 0;
      do {
        iVar2 = matchQuality(pFVar6,nArg,enc);
        if (iVar7 < iVar2) {
          data = pFVar6;
          iVar7 = iVar2;
        }
        pFVar6 = pFVar6->pNext;
      } while (pFVar6 != (FuncDef *)0x0);
    }
  }
  if ((createFlag != '\0') && (iVar7 < 6)) {
    data = (FuncDef *)sqlite3DbMallocZero(db,(ulong)(uVar1 + 0x39));
    if (data == (FuncDef *)0x0) {
      data = (FuncDef *)0x0;
    }
    else {
      pFVar6 = data + 1;
      data->zName = &pFVar6->nArg;
      data->nArg = (i8)nArg;
      data->funcFlags = (ushort)enc;
      memcpy(pFVar6,zName,(ulong)(uVar1 + 1));
      pFVar6 = (FuncDef *)sqlite3HashInsert(&db->aFunc,&pFVar6->nArg,data);
      if (pFVar6 == data) {
        sqlite3DbFree(db,data);
        if ((db->mallocFailed == '\0') && (db->bBenignMalloc == '\0')) {
          db->mallocFailed = '\x01';
          if (0 < db->nVdbeExec) {
            (db->u1).isInterrupted = 1;
          }
          (db->lookaside).bDisable = (db->lookaside).bDisable + 1;
        }
      }
      else {
        data->pNext = pFVar6;
      }
      if (pFVar6 == data) {
        return (FuncDef *)0x0;
      }
    }
  }
  if (data != (FuncDef *)0x0) {
    if (createFlag != '\0') {
      return data;
    }
    if (data->xSFunc != (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0) {
      return data;
    }
  }
  return (FuncDef *)0x0;
}

Assistant:

SQLITE_PRIVATE FuncDef *sqlite3FindFunction(
  sqlite3 *db,       /* An open database */
  const char *zName, /* Name of the function.  zero-terminated */
  int nArg,          /* Number of arguments.  -1 means any number */
  u8 enc,            /* Preferred text encoding */
  u8 createFlag      /* Create new entry if true and does not otherwise exist */
){
  FuncDef *p;         /* Iterator variable */
  FuncDef *pBest = 0; /* Best match found so far */
  int bestScore = 0;  /* Score of best match */
  int h;              /* Hash value */
  int nName;          /* Length of the name */

  assert( nArg>=(-2) );
  assert( nArg>=(-1) || createFlag==0 );
  nName = sqlite3Strlen30(zName);

  /* First search for a match amongst the application-defined functions.
  */
  p = (FuncDef*)sqlite3HashFind(&db->aFunc, zName);
  while( p ){
    int score = matchQuality(p, nArg, enc);
    if( score>bestScore ){
      pBest = p;
      bestScore = score;
    }
    p = p->pNext;
  }

  /* If no match is found, search the built-in functions.
  **
  ** If the SQLITE_PreferBuiltin flag is set, then search the built-in
  ** functions even if a prior app-defined function was found.  And give
  ** priority to built-in functions.
  **
  ** Except, if createFlag is true, that means that we are trying to
  ** install a new function.  Whatever FuncDef structure is returned it will
  ** have fields overwritten with new information appropriate for the
  ** new function.  But the FuncDefs for built-in functions are read-only.
  ** So we must not search for built-ins when creating a new function.
  */ 
  if( !createFlag && (pBest==0 || (db->flags & SQLITE_PreferBuiltin)!=0) ){
    bestScore = 0;
    h = (sqlite3UpperToLower[(u8)zName[0]] + nName) % SQLITE_FUNC_HASH_SZ;
    p = functionSearch(h, zName);
    while( p ){
      int score = matchQuality(p, nArg, enc);
      if( score>bestScore ){
        pBest = p;
        bestScore = score;
      }
      p = p->pNext;
    }
  }

  /* If the createFlag parameter is true and the search did not reveal an
  ** exact match for the name, number of arguments and encoding, then add a
  ** new entry to the hash table and return it.
  */
  if( createFlag && bestScore<FUNC_PERFECT_MATCH && 
      (pBest = sqlite3DbMallocZero(db, sizeof(*pBest)+nName+1))!=0 ){
    FuncDef *pOther;
    pBest->zName = (const char*)&pBest[1];
    pBest->nArg = (u16)nArg;
    pBest->funcFlags = enc;
    memcpy((char*)&pBest[1], zName, nName+1);
    pOther = (FuncDef*)sqlite3HashInsert(&db->aFunc, pBest->zName, pBest);
    if( pOther==pBest ){
      sqlite3DbFree(db, pBest);
      sqlite3OomFault(db);
      return 0;
    }else{
      pBest->pNext = pOther;
    }
  }

  if( pBest && (pBest->xSFunc || createFlag) ){
    return pBest;
  }
  return 0;
}